

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_Proto3PackedDynamicExtensions_Test::
TestBody(ExtensionSetTest_Proto3PackedDynamicExtensions_Test *this)

{
  bool bVar1;
  int size;
  uint32_t *puVar2;
  Arena *pAVar3;
  Descriptor *this_00;
  FileDescriptor *this_01;
  FieldDescriptorProto *this_02;
  DescriptorPool *underlay;
  char *pcVar4;
  void *data;
  char *in_R9;
  string_view value;
  AssertHelper local_538;
  Message local_530;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_4f8;
  Message local_4f0;
  bool local_4e1;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar__2;
  string reserialized_options;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__1;
  MessageOptions message_options;
  CodedInputStream coded_stream;
  ArrayInputStream input_stream;
  AssertHelper local_380;
  Message local_378;
  bool local_369;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_;
  string serialized_options;
  UnknownFieldSet unknown_fields;
  DynamicMessageFactory factory;
  AssertHelper local_2e0;
  Message local_2d8;
  void *local_2d0;
  FileDescriptor *local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar;
  DescriptorPool pool;
  FieldDescriptorProto *extension;
  undefined1 local_1a8 [8];
  FileDescriptorProto file_descriptor_proto;
  ExtensionSetTest_Proto3PackedDynamicExtensions_Test *this_local;
  
  file_descriptor_proto.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_1a8);
  puVar2 = HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 4;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_1a8);
  ArenaStringPtr::Set(&file_descriptor_proto.field_0._impl_.package_,"proto3",pAVar3);
  puVar2 = HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_1a8);
  ArenaStringPtr::Set((ArenaStringPtr *)
                      &file_descriptor_proto.field_0._impl_.option_dependency_.
                       super_RepeatedPtrFieldBase.arena_,
                      "google/protobuf/unittest_proto3_packed_extension.proto",pAVar3);
  puVar2 = HasBits<1>::operator[]
                     ((HasBits<1> *)
                      &file_descriptor_proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 2;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_1a8);
  ArenaStringPtr::Set(&file_descriptor_proto.field_0._impl_.name_,"proto3_unittest",pAVar3);
  this_00 = DescriptorProto::descriptor();
  this_01 = Descriptor::file(this_00);
  _extension = FileDescriptor::name(this_01);
  FileDescriptorProto::add_dependency<std::basic_string_view<char,std::char_traits<char>>>
            ((FileDescriptorProto *)local_1a8,
             (basic_string_view<char,_std::char_traits<char>_> *)&extension);
  this_02 = FileDescriptorProto::add_extension((FileDescriptorProto *)local_1a8);
  puVar2 = HasBits<1>::operator[](&(this_02->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)this_02);
  ArenaStringPtr::Set(&(this_02->field_0)._impl_.name_,"repeated_int32_option",pAVar3);
  MessageOptions::MessageOptions((MessageOptions *)&pool.feature_set_defaults_spec_);
  value = protobuf::MessageLite::GetTypeName((MessageLite *)&pool.feature_set_defaults_spec_);
  puVar2 = HasBits<1>::operator[](&(this_02->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 2;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)this_02);
  ArenaStringPtr::Set(&(this_02->field_0)._impl_.extendee_,value,pAVar3);
  MessageOptions::~MessageOptions((MessageOptions *)&pool.feature_set_defaults_spec_);
  FieldDescriptorProto::set_number(this_02,0xc359);
  FieldDescriptorProto::set_label(this_02,FieldDescriptorProto_Label_LABEL_REPEATED);
  FieldDescriptorProto::set_type(this_02,FieldDescriptorProto_Type_TYPE_INT32);
  puVar2 = HasBits<1>::operator[](&(this_02->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 0x10;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)this_02);
  ArenaStringPtr::Set(&(this_02->field_0)._impl_.json_name_,"repeatedInt32Option",pAVar3);
  underlay = DescriptorPool::generated_pool();
  DescriptorPool::DescriptorPool((DescriptorPool *)&gtest_ar.message_,underlay);
  local_2c8 = DescriptorPool::BuildFile
                        ((DescriptorPool *)&gtest_ar.message_,(FileDescriptorProto *)local_1a8);
  local_2d0 = (void *)0x0;
  testing::internal::CmpHelperNE<google::protobuf::FileDescriptor_const*,decltype(nullptr)>
            ((internal *)local_2c0,"pool.BuildFile(file_descriptor_proto)","nullptr",&local_2c8,
             &local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x55e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  if (bVar1) {
    DynamicMessageFactory::DynamicMessageFactory
              ((DynamicMessageFactory *)((long)&unknown_fields.fields_.soo_rep_.field_0 + 8));
    DynamicMessageFactory::SetDelegateToGeneratedFactory
              ((DynamicMessageFactory *)((long)&unknown_fields.fields_.soo_rep_.field_0 + 8),true);
    UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)((long)&serialized_options.field_2 + 8));
    UnknownFieldSet::AddVarint((UnknownFieldSet *)((long)&serialized_options.field_2 + 8),0xc359,1);
    std::__cxx11::string::string((string *)&gtest_ar_.message_);
    local_369 = UnknownFieldSet::SerializeToString
                          ((UnknownFieldSet *)((long)&serialized_options.field_2 + 8),
                           (string *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_368,&local_369,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
    if (!bVar1) {
      testing::Message::Message(&local_378);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&input_stream.position_,(internal *)local_368,
                 (AssertionResult *)"unknown_fields.SerializeToString(&serialized_options)","false",
                 "true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_380,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x567,pcVar4);
      testing::internal::AssertHelper::operator=(&local_380,&local_378);
      testing::internal::AssertHelper::~AssertHelper(&local_380);
      std::__cxx11::string::~string((string *)&input_stream.position_);
      testing::Message::~Message(&local_378);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
    if (bVar1) {
      data = (void *)std::__cxx11::string::data();
      size = std::__cxx11::string::size();
      protobuf::io::ArrayInputStream::ArrayInputStream
                ((ArrayInputStream *)&coded_stream.extension_factory_,data,size,-1);
      protobuf::io::CodedInputStream::CodedInputStream
                ((CodedInputStream *)((long)&message_options.field_0 + 0x40),
                 (ZeroCopyInputStream *)&coded_stream.extension_factory_);
      protobuf::io::CodedInputStream::SetExtensionRegistry
                ((CodedInputStream *)((long)&message_options.field_0 + 0x40),
                 (DescriptorPool *)&gtest_ar.message_,
                 (MessageFactory *)&unknown_fields.fields_.soo_rep_.field_0.short_rep.field_1);
      MessageOptions::MessageOptions((MessageOptions *)&gtest_ar__1.message_);
      local_479 = protobuf::MessageLite::ParseFromCodedStream
                            ((MessageLite *)&gtest_ar__1.message_,
                             (CodedInputStream *)((long)&message_options.field_0 + 0x40));
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_478,&local_479,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
      if (!bVar1) {
        testing::Message::Message(&local_488);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)((long)&reserialized_options.field_2 + 8),(internal *)local_478,
                   (AssertionResult *)"message_options.ParseFromCodedStream(&coded_stream)","false",
                   "true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_490,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x56f,pcVar4);
        testing::internal::AssertHelper::operator=(&local_490,&local_488);
        testing::internal::AssertHelper::~AssertHelper(&local_490);
        std::__cxx11::string::~string((string *)(reserialized_options.field_2._M_local_buf + 8));
        testing::Message::~Message(&local_488);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
      if (bVar1) {
        std::__cxx11::string::string((string *)&gtest_ar__2.message_);
        local_4e1 = protobuf::MessageLite::SerializeToString
                              ((MessageLite *)&gtest_ar__1.message_,(string *)&gtest_ar__2.message_)
        ;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_4e0,&local_4e1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
        if (!bVar1) {
          testing::Message::Message(&local_4f0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1.message_,(internal *)local_4e0,
                     (AssertionResult *)"message_options.SerializeToString(&reserialized_options)",
                     "false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_4f8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x574,pcVar4);
          testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
          testing::internal::AssertHelper::~AssertHelper(&local_4f8);
          std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
          testing::Message::~Message(&local_4f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
        if (bVar1) {
          testing::internal::EqHelper::
          Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
                    ((EqHelper *)local_528,"reserialized_options","\"\\xca\\xb5\\x18\\x01\\x01\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &gtest_ar__2.message_,&anon_var_dwarf_37cdd0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
          if (!bVar1) {
            testing::Message::Message(&local_530);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
            testing::internal::AssertHelper::AssertHelper
                      (&local_538,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                       ,0x575,pcVar4);
            testing::internal::AssertHelper::operator=(&local_538,&local_530);
            testing::internal::AssertHelper::~AssertHelper(&local_538);
            testing::Message::~Message(&local_530);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
        }
        std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      }
      MessageOptions::~MessageOptions((MessageOptions *)&gtest_ar__1.message_);
      protobuf::io::CodedInputStream::~CodedInputStream
                ((CodedInputStream *)((long)&message_options.field_0 + 0x40));
      protobuf::io::ArrayInputStream::~ArrayInputStream
                ((ArrayInputStream *)&coded_stream.extension_factory_);
    }
    std::__cxx11::string::~string((string *)&gtest_ar_.message_);
    UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)((long)&serialized_options.field_2 + 8));
    DynamicMessageFactory::~DynamicMessageFactory
              ((DynamicMessageFactory *)((long)&unknown_fields.fields_.soo_rep_.field_0 + 8));
  }
  DescriptorPool::~DescriptorPool((DescriptorPool *)&gtest_ar.message_);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_1a8);
  return;
}

Assistant:

TEST(ExtensionSetTest, Proto3PackedDynamicExtensions) {
  // Regression test for b/271121265. This test case verifies that
  // packed-by-default repeated custom options in proto3 are correctly
  // serialized in packed form when dynamic extensions are used.

  // Create a custom option in proto3 and load this into an overlay
  // DescriptorPool with a DynamicMessageFactory.
  google::protobuf::FileDescriptorProto file_descriptor_proto;
  file_descriptor_proto.set_syntax("proto3");
  file_descriptor_proto.set_name(
      "google/protobuf/unittest_proto3_packed_extension.proto");
  file_descriptor_proto.set_package("proto3_unittest");
  file_descriptor_proto.add_dependency(
      DescriptorProto::descriptor()->file()->name());
  FieldDescriptorProto* extension = file_descriptor_proto.add_extension();
  extension->set_name("repeated_int32_option");
  extension->set_extendee(MessageOptions().GetTypeName());
  extension->set_number(50009);
  extension->set_label(FieldDescriptorProto::LABEL_REPEATED);
  extension->set_type(FieldDescriptorProto::TYPE_INT32);
  extension->set_json_name("repeatedInt32Option");
  google::protobuf::DescriptorPool pool(DescriptorPool::generated_pool());
  ASSERT_NE(pool.BuildFile(file_descriptor_proto), nullptr);
  DynamicMessageFactory factory;
  factory.SetDelegateToGeneratedFactory(true);

  // Create a serialized MessageOptions proto equivalent to:
  // [proto3_unittest.repeated_int32_option]: 1
  UnknownFieldSet unknown_fields;
  unknown_fields.AddVarint(50009, 1);
  std::string serialized_options;
  ASSERT_TRUE(unknown_fields.SerializeToString(&serialized_options));

  // Parse the MessageOptions using our custom extension registry.
  io::ArrayInputStream input_stream(serialized_options.data(),
                                    serialized_options.size());
  io::CodedInputStream coded_stream(&input_stream);
  coded_stream.SetExtensionRegistry(&pool, &factory);
  MessageOptions message_options;
  ASSERT_TRUE(message_options.ParseFromCodedStream(&coded_stream));

  // Finally, serialize the proto again and verify that the repeated option has
  // been correctly serialized in packed form.
  std::string reserialized_options;
  ASSERT_TRUE(message_options.SerializeToString(&reserialized_options));
  EXPECT_EQ(reserialized_options, "\xca\xb5\x18\x01\x01");
}